

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1Parser.cpp
# Opt level: O3

void __thiscall VC1SequenceHeader::setFPS(VC1SequenceHeader *this,double value)

{
  uint uVar1;
  long lVar2;
  undefined4 *puVar3;
  int value_00;
  uint uVar4;
  ostringstream ss;
  uint *local_1e0;
  undefined8 local_1d8;
  uint local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  uint *local_1c0;
  undefined8 local_1b8;
  uint local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  double local_1a0;
  ostringstream local_198 [376];
  
  if (this->m_fpsFieldBitVal < 1) {
    return;
  }
  local_1a0 = value;
  lVar2 = lround(value);
  uVar4 = (int)lVar2 * 1000;
  lVar2 = lround((double)(int)uVar4 / local_1a0);
  if ((int)uVar4 < 30000) {
    if ((uVar4 != 24000) && (uVar4 != 25000)) goto LAB_001e8272;
  }
  else if ((uVar4 != 30000) && ((uVar4 != 60000 && (uVar4 != 50000)))) goto LAB_001e8272;
  uVar1 = (uint)lVar2;
  if ((uVar1 & 0xfffffffe) != 1000) {
LAB_001e8272:
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "Can\'t overwrite stream fps. Non standard fps values not supported for VC-1 streams"
               ,0x52);
    puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar3 = 0x15f;
    *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
    if (local_1c0 == &local_1b0) {
      puVar3[6] = local_1b0;
      puVar3[7] = uStack_1ac;
      puVar3[8] = uStack_1a8;
      puVar3[9] = uStack_1a4;
    }
    else {
      *(uint **)(puVar3 + 2) = local_1c0;
      *(ulong *)(puVar3 + 6) = CONCAT44(uStack_1ac,local_1b0);
    }
    *(undefined8 *)(puVar3 + 4) = local_1b8;
    local_1b8 = 0;
    local_1b0 = local_1b0 & 0xffffff00;
    local_1c0 = &local_1b0;
    __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  this->time_base_den = uVar4;
  this->time_base_num = uVar1;
  uVar4 = uVar4 & 0xffff;
  if (uVar4 < 30000) {
    value_00 = 1;
    if (uVar4 != 24000) {
      if (uVar4 != 25000) {
LAB_001e82da:
        std::__cxx11::ostringstream::ostringstream(local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,
                   "Can\'t overwrite stream fps. Non standard fps values not supported for VC-1 streams"
                   ,0x52);
        puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar3 = 0x15f;
        *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
        if (local_1e0 == &local_1d0) {
          puVar3[6] = local_1d0;
          puVar3[7] = uStack_1cc;
          puVar3[8] = uStack_1c8;
          puVar3[9] = uStack_1c4;
        }
        else {
          *(uint **)(puVar3 + 2) = local_1e0;
          *(ulong *)(puVar3 + 6) = CONCAT44(uStack_1cc,local_1d0);
        }
        *(undefined8 *)(puVar3 + 4) = local_1d8;
        local_1d0 = local_1d0 & 0xffffff00;
        __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      value_00 = 2;
    }
  }
  else if (uVar4 == 30000) {
    value_00 = 3;
  }
  else if (uVar4 == 50000) {
    value_00 = 4;
  }
  else {
    if (uVar4 != 60000) goto LAB_001e82da;
    value_00 = 5;
  }
  VC1Unit::updateBits(&this->super_VC1Unit,this->m_fpsFieldBitVal,8,value_00);
  VC1Unit::updateBits(&this->super_VC1Unit,this->m_fpsFieldBitVal + 8,4,(uVar1 != 1000) + 1);
  return;
}

Assistant:

void VC1SequenceHeader::setFPS(const double value)
{
    // if (value < 25.0 && pulldown)
    //	value *= 1.25;

    if (m_fpsFieldBitVal > 0)
    {
        int nr;
        const int time_scale = lround(value) * 1000;
        const int num_units_in_tick = lround(time_scale / value);
        if ((time_scale == 24000 || time_scale == 25000 || time_scale == 30000 || time_scale == 50000 ||
             time_scale == 60000) &&
            (num_units_in_tick == 1000 || num_units_in_tick == 1001))
        {
            time_base_den = time_scale;
            time_base_num = num_units_in_tick;
        }
        else
            THROW(ERR_VC1_ERR_FPS, "Can't overwrite stream fps. Non standard fps values not supported for VC-1 streams")

        switch (time_scale)
        {
        case 24000:
            nr = 1;
            break;
        case 25000:
            nr = 2;
            break;
        case 30000:
            nr = 3;
            break;
        case 50000:
            nr = 4;
            break;
        case 60000:
            nr = 5;
            break;
        default:
            THROW(ERR_VC1_ERR_FPS, "Can't overwrite stream fps. Non standard fps values not supported for VC-1 streams")
        }
        const int dr = (num_units_in_tick == 1000) ? 1 : 2;

        updateBits(m_fpsFieldBitVal, 8, nr);
        updateBits(m_fpsFieldBitVal + 8, 4, dr);
    }
}